

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::addRows(HighsSparseMatrix *this,HighsSparseMatrix *new_rows,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int *piVar1;
  uint uVar2;
  MatrixFormat MVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  size_type __new_size;
  int iVar14;
  ulong uVar15;
  size_type sVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  vector<double,_std::allocator<double>_> *this_02;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  vector<int,_std::allocator<int>_> save_p_end;
  undefined1 local_68 [16];
  pointer local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  HighsSparseMatrix *local_40;
  value_type_conflict2 local_34;
  
  uVar2 = new_rows->num_row_;
  uVar20 = (ulong)uVar2;
  uVar13 = uVar2;
  if (new_rows->format_ == kColwise) {
    uVar13 = new_rows->num_col_;
  }
  if (uVar20 == 0) {
    return;
  }
  uVar13 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(int)uVar13];
  MVar3 = this->format_;
  iVar21 = this->num_col_;
  iVar4 = this->num_row_;
  lVar23 = (long)iVar4;
  iVar14 = iVar4;
  if (MVar3 == kColwise) {
    iVar14 = iVar21;
  }
  iVar14 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar14];
  if ((MVar3 == kColwise) && (iVar14 < (int)uVar13)) {
    ensureRowwise(this);
  }
  __new_size = (size_type)(int)uVar2;
  this_00 = &this->start_;
  iVar24 = iVar14 + uVar13;
  if ((this->format_ & ~kColwise) == kRowwise) {
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)(uVar2 + iVar4 + 1));
    auVar12 = _DAT_003c57d0;
    if (uVar13 == 0) {
      if (0 < (int)uVar2) {
        piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar19 = uVar20 - 1;
        auVar25._8_4_ = (int)lVar19;
        auVar25._0_8_ = lVar19;
        auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
        lVar19 = 0;
        auVar25 = auVar25 ^ _DAT_003c57d0;
        auVar26 = _DAT_003c57b0;
        auVar27 = _DAT_003c57c0;
        do {
          auVar28 = auVar27 ^ auVar12;
          iVar21 = auVar25._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar21 && auVar25._0_4_ < auVar28._0_4_ ||
                      iVar21 < auVar28._4_4_) & 1)) {
            *(int *)((long)piVar5 + lVar19 + lVar23 * 4) = iVar14;
          }
          if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
              auVar28._12_4_ <= auVar25._12_4_) {
            *(int *)((long)piVar5 + lVar19 + lVar23 * 4 + 4) = iVar14;
          }
          auVar28 = auVar26 ^ auVar12;
          iVar29 = auVar28._4_4_;
          if (iVar29 <= iVar21 && (iVar29 != iVar21 || auVar28._0_4_ <= auVar25._0_4_)) {
            *(int *)((long)piVar5 + lVar19 + lVar23 * 4 + 8) = iVar14;
            *(int *)((long)piVar5 + lVar19 + lVar23 * 4 + 0xc) = iVar14;
          }
          lVar22 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 4;
          auVar27._8_8_ = lVar22 + 4;
          lVar22 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 4;
          auVar26._8_8_ = lVar22 + 4;
          lVar19 = lVar19 + 0x10;
        } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar19);
      }
    }
    else if (0 < (int)uVar2) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        piVar6[lVar23 + uVar17] = piVar5[uVar17] + iVar14;
        uVar17 = uVar17 + 1;
      } while (uVar20 != uVar17);
    }
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[(int)(uVar2 + iVar4)] = iVar24;
    if ((int)uVar13 < 1) goto LAB_003814d3;
    this_01 = &this->index_;
    std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar24);
    this_02 = &this->value_;
    std::vector<double,_std::allocator<double>_>::resize(this_02,(long)iVar24);
    if (MVar3 != kRowwisePartitioned) {
      piVar5 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
      do {
        piVar6[(long)iVar14 + uVar20] = piVar5[uVar20];
        pdVar10[(long)iVar14 + uVar20] = pdVar9[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar13 != uVar20);
      goto LAB_003814d3;
    }
    if (0 < (int)uVar2) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        lVar19 = (long)piVar5[uVar17];
        uVar15 = uVar17 + 1;
        if (piVar5[uVar17] < piVar5[uVar17 + 1]) {
          piVar6 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar21 = piVar6[lVar19];
            if (in_partition[iVar21] != '\0') {
              iVar4 = piVar7[uVar17 + lVar23];
              piVar8[iVar4] = iVar21;
              pdVar9[iVar4] =
                   (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19];
              piVar1 = piVar7 + uVar17 + lVar23;
              *piVar1 = *piVar1 + 1;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < piVar5[uVar15]);
        }
        uVar17 = uVar15;
      } while (uVar15 != uVar20);
    }
    local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_68,__new_size);
    if (0 < (int)uVar2) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        iVar21 = piVar5[uVar17] + iVar14;
        piVar6[lVar23 + uVar17] = iVar21;
        piVar7[lVar23 + uVar17] = iVar21;
        *(int *)(local_68._0_8_ + uVar17 * 4) = iVar21;
        uVar17 = uVar17 + 1;
      } while (uVar20 != uVar17);
    }
    if (0 < (int)uVar2) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        lVar19 = (long)piVar5[uVar17];
        uVar15 = uVar17 + 1;
        if (piVar5[uVar17] < piVar5[uVar17 + 1]) {
          piVar6 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar21 = piVar6[lVar19];
            if (in_partition[iVar21] == '\0') {
              iVar4 = piVar7[uVar17 + lVar23];
              piVar8[iVar4] = iVar21;
              pdVar9[iVar4] =
                   (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19];
              piVar1 = piVar7 + uVar17 + lVar23;
              *piVar1 = *piVar1 + 1;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < piVar5[uVar15]);
        }
        uVar17 = uVar15;
      } while (uVar15 != uVar20);
    }
    if (0 < (int)uVar2) {
      piVar5 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar16 = 0;
      do {
        piVar5[lVar23 + sVar16] = *(int *)(local_68._0_8_ + sVar16 * 4);
        sVar16 = sVar16 + 1;
      } while (__new_size != sVar16);
    }
  }
  else {
    if (uVar13 == 0) goto LAB_003814d3;
    local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)local_68,(long)iVar21,&local_34);
    if (0 < (int)uVar13) {
      piVar5 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = 0;
      do {
        *(int *)(local_68._0_8_ + (long)piVar5[uVar20] * 4) =
             *(int *)(local_68._0_8_ + (long)piVar5[uVar20] * 4) + 1;
        uVar20 = uVar20 + 1;
      } while (uVar13 != uVar20);
    }
    local_48 = &this->index_;
    std::vector<int,_std::allocator<int>_>::resize(local_48,(long)iVar24);
    local_50 = &this->value_;
    std::vector<double,_std::allocator<double>_>::resize(local_50,(long)iVar24);
    if (0 < iVar21) {
      piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar16 = (long)iVar21;
      do {
        iVar21 = iVar24 - *(int *)(local_68._0_8_ + (sVar16 - 1) * 4);
        lVar23 = (long)piVar5[sVar16];
        if (piVar5[sVar16 - 1] < piVar5[sVar16]) {
          lVar19 = 0;
          do {
            piVar6[(long)iVar21 + lVar19 + -1] = piVar6[lVar23 + lVar19 + -1];
            pdVar9[(long)iVar21 + lVar19 + -1] = pdVar9[lVar23 + lVar19 + -1];
            lVar22 = lVar23 + lVar19;
            lVar19 = lVar19 + -1;
          } while ((long)piVar5[sVar16 - 1] < lVar22 + -1);
          iVar21 = iVar21 + (int)lVar19;
        }
        piVar5[sVar16] = iVar24;
        bVar11 = 1 < (long)sVar16;
        sVar16 = sVar16 - 1;
        iVar24 = iVar21;
        local_40 = new_rows;
      } while (bVar11);
    }
    if (0 < (int)uVar2) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar16 = 0;
      do {
        uVar18 = uVar13;
        if ((long)sVar16 < (long)(__new_size - 1)) {
          uVar18 = piVar5[sVar16 + 1];
        }
        iVar21 = piVar5[sVar16];
        lVar23 = (long)iVar21;
        if (iVar21 < (int)uVar18) {
          piVar8 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            lVar22 = (long)piVar8[lVar23];
            lVar19 = (long)piVar6[lVar22 + 1] - (long)*(int *)(local_68._0_8_ + lVar22 * 4);
            *(int *)(local_68._0_8_ + lVar22 * 4) = *(int *)(local_68._0_8_ + lVar22 * 4) + -1;
            piVar7[lVar19] = (int)sVar16 + iVar4;
            pdVar9[lVar19] = pdVar10[lVar23];
            lVar23 = lVar23 + 1;
          } while ((int)uVar18 != lVar23);
        }
        sVar16 = sVar16 + 1;
      } while (sVar16 != __new_size);
    }
  }
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
LAB_003814d3:
  this->num_row_ = this->num_row_ + uVar2;
  return;
}

Assistant:

void HighsSparseMatrix::addRows(const HighsSparseMatrix new_rows,
                                const int8_t* in_partition) {
  assert(new_rows.isRowwise());
  const HighsInt num_new_row = new_rows.num_row_;
  const HighsInt num_new_nz = new_rows.numNz();
  const vector<HighsInt>& new_matrix_start = new_rows.start_;
  const vector<HighsInt>& new_matrix_index = new_rows.index_;
  const vector<double>& new_matrix_value = new_rows.value_;

  assert(this->formatOk());
  // Adding rows to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  if (partitioned) {
    assert(1 == 0);
    assert(in_partition != NULL);
  }
  assert(num_new_row >= 0);
  assert(num_new_nz >= 0);
  if (num_new_row == 0) {
    // No rows are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of rows to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no columns
  assert(num_new_nz <= 0 || num_col > 0);

  if (this->isColwise()) {
    // Matrix is currently a standard col-wise matrix, so flip
    // row-wise if there are more new nonzeros than current nonzeros
    if (num_new_nz > num_nz) this->ensureRowwise();
  }
  // Determine the new number of rows and nonzeros in the matrix
  HighsInt new_num_nz = num_nz + num_new_nz;
  HighsInt new_num_row = num_row + num_new_row;

  if (this->isRowwise()) {
    // Matrix is row-wise
    this->start_.resize(new_num_row + 1);
    // Append the starts of the new rows
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz + new_matrix_start[iNewRow];
    } else {
      // No nonzeros being added, so new_matrix_start may be NULL, but entries
      // of zero are implied.
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz;
    }
    this->start_[new_num_row] = new_num_nz;
    if (num_new_nz > 0) {
      // Adding a non-trivial matrix: resize the matrix arrays accordingly
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Copy in the new indices and values
      if (partitioned) {
        // Insert the entries in the partition
        assert(1 == 0);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (in_partition[iCol]) {
              HighsInt iEl = this->start_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->start_[iRow]++;
            }
          }
        }
        // Use the incremented starts to initialise p_end, save these
        // values and reset the starts
        vector<HighsInt> save_p_end;
        save_p_end.resize(num_new_row);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          this->start_[iRow] = num_nz + new_matrix_start[iNewRow];
          this->p_end_[iRow] = this->start_[iRow];
          save_p_end[iNewRow] = this->p_end_[iRow];
        }
        // Insert the entries not in the partition
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (!in_partition[iCol]) {
              HighsInt iEl = this->p_end_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->p_end_[iRow]++;
            }
          }
        }
        // Reset p_end using the saved values
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
          this->p_end_[num_row + iNewRow] = save_p_end[iNewRow];
      } else {
        for (HighsInt iNewEl = 0; iNewEl < num_new_nz; iNewEl++) {
          this->index_[num_nz + iNewEl] = new_matrix_index[iNewEl];
          this->value_[num_nz + iNewEl] = new_matrix_value[iNewEl];
        }
      }
    }
  } else {
    // Storing the matrix column-wise, so have to insert the new rows
    assert(this->isColwise());
    if (num_new_nz) {
      vector<HighsInt> length;
      length.assign(num_col, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        length[new_matrix_index[iEl]]++;
      // Determine the new number of nonzeros and resize the column-wise matrix
      // arrays
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Append the new rows
      // Shift the existing columns to make space for the new entries
      HighsInt new_iEl = new_num_nz;
      for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
        HighsInt start_col_plus_1 = new_iEl;
        new_iEl -= length[iCol];
        for (HighsInt iEl = this->start_[iCol + 1] - 1;
             iEl >= this->start_[iCol]; iEl--) {
          new_iEl--;
          this->index_[new_iEl] = this->index_[iEl];
          this->value_[new_iEl] = this->value_[iEl];
        }
        this->start_[iCol + 1] = start_col_plus_1;
      }
      assert(new_iEl == 0);
      // Insert the new entries
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
        HighsInt first_el = new_matrix_start[iNewRow];
        HighsInt last_el =
            (iNewRow < num_new_row - 1 ? new_matrix_start[iNewRow + 1]
                                       : num_new_nz);
        for (HighsInt iEl = first_el; iEl < last_el; iEl++) {
          HighsInt iCol = new_matrix_index[iEl];
          new_iEl = this->start_[iCol + 1] - length[iCol];
          length[iCol]--;
          this->index_[new_iEl] = num_row + iNewRow;
          this->value_[new_iEl] = new_matrix_value[iEl];
        }
      }
    }
  }
  // Update the number of rows
  this->num_row_ += num_new_row;
}